

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_data.hpp
# Opt level: O0

void __thiscall
boost::detail::interruption_checker::interruption_checker
          (interruption_checker *this,pthread_mutex_t *cond_mutex,pthread_cond_t *cond)

{
  int iVar1;
  thread_data_base *ptVar2;
  pthread_cond_t *in_RDX;
  pthread_mutex_t *in_RSI;
  interruption_checker *in_RDI;
  lock_guard<boost::mutex> guard;
  mutex *in_stack_ffffffffffffffb8;
  byte local_2d;
  
  ptVar2 = get_current_thread_data();
  in_RDI->thread_info = ptVar2;
  in_RDI->m = in_RSI;
  local_2d = 0;
  if (in_RDI->thread_info != (thread_data_base *)0x0) {
    local_2d = in_RDI->thread_info->interrupt_enabled;
  }
  in_RDI->set = (bool)(local_2d & 1);
  in_RDI->done = false;
  if ((in_RDI->set & 1U) == 0) {
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)in_RDI->m);
    if (iVar1 != 0) {
      __assert_fail("!pthread_mutex_lock(m)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/thread/pthread/thread_data.hpp"
                    ,0xd5,
                    "boost::detail::interruption_checker::interruption_checker(pthread_mutex_t *, pthread_cond_t *)"
                   );
    }
  }
  else {
    lock_guard<boost::mutex>::lock_guard
              ((lock_guard<boost::mutex> *)in_RDI,in_stack_ffffffffffffffb8);
    check_for_interruption(in_RDI);
    in_RDI->thread_info->cond_mutex = in_RSI;
    in_RDI->thread_info->current_cond = in_RDX;
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)in_RDI->m);
    if (iVar1 != 0) {
      __assert_fail("!pthread_mutex_lock(m)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/thread/pthread/thread_data.hpp"
                    ,0xd1,
                    "boost::detail::interruption_checker::interruption_checker(pthread_mutex_t *, pthread_cond_t *)"
                   );
    }
    lock_guard<boost::mutex>::~lock_guard((lock_guard<boost::mutex> *)0x2a785f);
  }
  return;
}

Assistant:

explicit interruption_checker(pthread_mutex_t* cond_mutex,pthread_cond_t* cond):
                thread_info(detail::get_current_thread_data()),m(cond_mutex),
                set(thread_info && thread_info->interrupt_enabled), done(false)
            {
                if(set)
                {
                    lock_guard<mutex> guard(thread_info->data_mutex);
                    check_for_interruption();
                    thread_info->cond_mutex=cond_mutex;
                    thread_info->current_cond=cond;
                    BOOST_VERIFY(!pthread_mutex_lock(m));
                }
                else
                {
                    BOOST_VERIFY(!pthread_mutex_lock(m));
                }
            }